

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

void __thiscall ON_SubDHeap::ON_SubDHeap(ON_SubDHeap *this)

{
  this->m_ws = (tagWSItem *)0x0;
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fspv);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fspe);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fspf);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp5);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp9);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp17);
  this->m_full_fragment_display_density = 0;
  this->m_full_fragment_count_estimate = 0;
  this->m_part_fragment_count_estimate = 0;
  this->m_reserved0 = 0;
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp_full_fragments);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp_part_fragments);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp_oddball_fragments);
  this->m_unused_fragments[4] = (ON_FixedSizePoolElement *)0x0;
  this->m_unused_fragments[5] = (ON_FixedSizePoolElement *)0x0;
  this->m_unused_fragments[2] = (ON_FixedSizePoolElement *)0x0;
  this->m_unused_fragments[3] = (ON_FixedSizePoolElement *)0x0;
  this->m_unused_fragments[0] = (ON_FixedSizePoolElement *)0x0;
  this->m_unused_fragments[1] = (ON_FixedSizePoolElement *)0x0;
  this->m_unused_fragments[6] = (ON_FixedSizePoolElement *)0x0;
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp_limit_curves);
  this->m_unused_face = (ON_SubDFace *)0x0;
  this->m_max_vertex_id = 0;
  this->m_max_edge_id = 0;
  this->m_unused_vertex = (ON_SubDVertex *)0x0;
  this->m_unused_edge = (ON_SubDEdge *)0x0;
  this->m_max_face_id = 0;
  this->m_reserved2 = 0;
  ON_FixedSizePool::Create(&this->m_fspv,0x108,0,0);
  ON_FixedSizePool::Create(&this->m_fspe,0xb0,0,0);
  ON_FixedSizePool::Create(&this->m_fspf,0xd8,0,0);
  ON_FixedSizePool::Create(&this->m_fsp5,0x28,0,0);
  ON_FixedSizePool::Create(&this->m_fsp9,0x48,0,0);
  ON_FixedSizePool::Create(&this->m_fsp17,0x88,0,0);
  if (m_offset_vertex_id == 0) {
    m_offset_vertex_id = 8;
    m_offset_edge_id = 8;
    m_offset_face_id = 8;
  }
  return;
}

Assistant:

ON_SubDHeap::ON_SubDHeap()
{
  m_fspv.Create(sizeof(class ON_SubDVertex), 0, 0);
  m_fspe.Create(sizeof(class ON_SubDEdge), 0, 0);
  m_fspf.Create(sizeof(class ON_SubDFace), 0, 0);
  m_fsp5.Create(5 * sizeof(ON__UINT_PTR), 0, 0);
  m_fsp9.Create(9 * sizeof(ON__UINT_PTR), 0, 0);
  m_fsp17.Create(17 * sizeof(ON__UINT_PTR), 0, 0);

  if (0 == ON_SubDHeap::m_offset_vertex_id)
  {
    ON_SubDVertex v;
    ON_SubDHeap::m_offset_vertex_id = ((const char*)(&v.m_id)) - ((const char*)&v);
    ON_SubDEdge e;
    ON_SubDHeap::m_offset_edge_id = ((const char*)(&e.m_id)) - ((const char*)&e);
    ON_SubDFace f;
    ON_SubDHeap::m_offset_face_id = ((const char*)(&f.m_id)) - ((const char*)&f);
  }
}